

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ftsdf.c
# Opt level: O3

FT_Error sdf_raster_new(FT_Memory memory,SDF_PRaster *araster)

{
  SDF_PRaster pSVar1;
  FT_Error error;
  int local_1c;
  
  pSVar1 = (SDF_PRaster)ft_mem_alloc(memory,8,&local_1c);
  if (local_1c == 0) {
    pSVar1->memory = memory;
  }
  *araster = pSVar1;
  return local_1c;
}

Assistant:

static FT_Error
  sdf_raster_new( FT_Memory     memory,
                  SDF_PRaster*  araster )
  {
    FT_Error     error;
    SDF_PRaster  raster = NULL;


    if ( !FT_NEW( raster ) )
      raster->memory = memory;

    *araster = raster;

   return error;
  }